

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plot.hpp
# Opt level: O1

DrawSpecs * __thiscall
sciplot::Plot::
drawWithVecs<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>>
          (Plot *this,string *with,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *x,vector<double,_std::allocator<double>_> *vecs)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pDVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  ulong uVar8;
  undefined8 uVar9;
  string __str;
  string use;
  ostringstream datastream;
  ulong *local_290;
  long local_288;
  ulong local_280;
  long lStack_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 *local_230;
  long local_228;
  undefined1 local_220;
  undefined7 uStack_21f;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  size_t local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  gnuplot::
  writedataset<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>>
            ((ostream *)local_1a8,this->m_numdatasets,x,vecs);
  local_230 = &local_220;
  local_228 = 0;
  local_220 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_230,0,(char *)0x0,0x18e637);
  paVar2 = &local_250.field_2;
  local_250._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_250,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_250._M_dataplus._M_p,1,2);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_280 = *puVar7;
    lStack_278 = plVar5[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *puVar7;
    local_290 = (ulong *)*plVar5;
  }
  local_288 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_290);
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_230);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&this->m_data,(ulong)local_290);
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  std::operator+(&local_250,"\'",&this->m_datafilename);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_280 = *puVar7;
    lStack_278 = plVar5[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *puVar7;
    local_290 = (ulong *)*plVar5;
  }
  local_288 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1b0 = this->m_numdatasets;
  this->m_numdatasets = local_1b0 + 1;
  internal::str<unsigned_long>(&local_210,&local_1b0);
  uVar8 = 0xf;
  if (local_290 != &local_280) {
    uVar8 = local_280;
  }
  if (uVar8 < local_210._M_string_length + local_288) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      uVar9 = local_210.field_2._M_allocated_capacity;
    }
    if (local_210._M_string_length + local_288 <= (ulong)uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_290);
      goto LAB_0016e236;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_210._M_dataplus._M_p);
LAB_0016e236:
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_270.field_2._M_allocated_capacity = *psVar1;
    local_270.field_2._8_4_ = *(undefined4 *)(puVar6 + 3);
    local_270.field_2._12_4_ = *(undefined4 *)((long)puVar6 + 0x1c);
  }
  else {
    local_270.field_2._M_allocated_capacity = *psVar1;
    local_270._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_270._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d0,local_230,local_230 + local_228);
  pcVar3 = (with->_M_dataplus)._M_p;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar3,pcVar3 + with->_M_string_length);
  std::vector<sciplot::DrawSpecs,std::allocator<sciplot::DrawSpecs>>::
  emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
            ((vector<sciplot::DrawSpecs,std::allocator<sciplot::DrawSpecs>> *)&this->m_drawspecs,
             &local_270,&local_1d0,&local_1f0);
  pDVar4 = (this->m_drawspecs).
           super__Vector_base<sciplot::DrawSpecs,_std::allocator<sciplot::DrawSpecs>_>._M_impl.
           super__Vector_impl_data._M_finish;
  LineSpecsOf<sciplot::DrawSpecs>::lineStyle
            (&pDVar4[-1].super_LineSpecsOf<sciplot::DrawSpecs>,
             (int)((ulong)((long)pDVar4 -
                          (long)(this->m_drawspecs).
                                super__Vector_base<sciplot::DrawSpecs,_std::allocator<sciplot::DrawSpecs>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x6fd0eb67);
  pDVar4 = (this->m_drawspecs).
           super__Vector_base<sciplot::DrawSpecs,_std::allocator<sciplot::DrawSpecs>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return pDVar4 + -1;
}

Assistant:

inline auto Plot::drawWithVecs(std::string with, const X& x, const Vecs&... vecs) -> DrawSpecs&
{
    // Write the given vectors x and y as a new data set to the stream
    std::ostringstream datastream;
    gnuplot::writedataset(datastream, m_numdatasets, x, vecs...);

    // Set the using string to "" if X is not vector of strings.
    // Otherwise, x contain xtics strings. Set the `using` string
    // so that these are properly used as xtics.
    std::string use;
    if constexpr(internal::isStringVector<X>) {
        const auto nvecs = sizeof...(Vecs);
        use = "0:"; // here, column 0 means the pseudo column with numbers 0, 1, 2, 3...
        for(auto i = 2; i <= nvecs + 1; ++i)
            use += std::to_string(i) + ":"; // this constructs 0:2:3:4:
        use += "xtic(1)"; // this terminates the string with 0:2:3:4:xtic(1), and thus column 1 is used for the xtics
    }

    // Append new data set to existing data
    m_data += datastream.str();

    // Draw the data saved using a data set with index `m_numdatasets`. Increase number of data sets
    return draw("'" + m_datafilename + "' index " + internal::str(m_numdatasets++), use, with);
}